

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# countdown_latch_test.cpp
# Opt level: O2

void __thiscall
bidfx_public_api::tools::CountdownLatchTest_TestCountdownLatchCounter_Test::TestBody
          (CountdownLatchTest_TestCountdownLatchCounter_Test *this)

{
  CountdownLatch *this_00;
  char *pcVar1;
  AssertHelper local_38;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  AssertionResult gtest_ar;
  
  this_00 = (CountdownLatch *)operator_new(0x60);
  bidfx_public_api::tools::CountdownLatch::CountdownLatch(this_00,5);
  local_30.ptr_._0_4_ = 5;
  local_38.data_._0_4_ = bidfx_public_api::tools::CountdownLatch::GetCount();
  testing::internal::CmpHelperEQ<int,unsigned_int>
            ((internal *)&gtest_ar,"5","latch->GetCount()",(int *)&local_30,(uint *)&local_38);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_30);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/countdown_latch_test.cpp"
               ,0x20,pcVar1);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_30);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    bidfx_public_api::tools::CountdownLatch::CountDown();
    local_30.ptr_._0_4_ = 4;
    local_38.data_._0_4_ = bidfx_public_api::tools::CountdownLatch::GetCount();
    testing::internal::CmpHelperEQ<int,unsigned_int>
              ((internal *)&gtest_ar,"4","latch->GetCount()",(int *)&local_30,(uint *)&local_38);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_30);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar1 = "";
      }
      else {
        pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_38,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/countdown_latch_test.cpp"
                 ,0x22,pcVar1);
      testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_30);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      bidfx_public_api::tools::CountdownLatch::CountDown();
      local_30.ptr_._0_4_ = 3;
      local_38.data_._0_4_ = bidfx_public_api::tools::CountdownLatch::GetCount();
      testing::internal::CmpHelperEQ<int,unsigned_int>
                ((internal *)&gtest_ar,"3","latch->GetCount()",(int *)&local_30,(uint *)&local_38);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_30);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar1 = "";
        }
        else {
          pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_38,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/countdown_latch_test.cpp"
                   ,0x24,pcVar1);
        testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_30);
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar.message_);
        bidfx_public_api::tools::CountdownLatch::CountDown();
        local_30.ptr_._0_4_ = 2;
        local_38.data_._0_4_ = bidfx_public_api::tools::CountdownLatch::GetCount();
        testing::internal::CmpHelperEQ<int,unsigned_int>
                  ((internal *)&gtest_ar,"2","latch->GetCount()",(int *)&local_30,(uint *)&local_38)
        ;
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&local_30);
          if (gtest_ar.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar1 = "";
          }
          else {
            pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_38,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/countdown_latch_test.cpp"
                     ,0x26,pcVar1);
          testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_30);
        }
        else {
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&gtest_ar.message_);
          bidfx_public_api::tools::CountdownLatch::CountDown();
          local_30.ptr_._0_4_ = 1;
          local_38.data_._0_4_ = bidfx_public_api::tools::CountdownLatch::GetCount();
          testing::internal::CmpHelperEQ<int,unsigned_int>
                    ((internal *)&gtest_ar,"1","latch->GetCount()",(int *)&local_30,
                     (uint *)&local_38);
          if (gtest_ar.success_ == false) {
            testing::Message::Message((Message *)&local_30);
            if (gtest_ar.message_.ptr_ ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar1 = "";
            }
            else {
              pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_38,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/countdown_latch_test.cpp"
                       ,0x28,pcVar1);
            testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_30);
          }
          else {
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr(&gtest_ar.message_);
            bidfx_public_api::tools::CountdownLatch::CountDown();
            local_30.ptr_._0_4_ = 0;
            local_38.data_._0_4_ = bidfx_public_api::tools::CountdownLatch::GetCount();
            testing::internal::CmpHelperEQ<int,unsigned_int>
                      ((internal *)&gtest_ar,"0","latch->GetCount()",(int *)&local_30,
                       (uint *)&local_38);
            if (gtest_ar.success_ != false) {
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~scoped_ptr(&gtest_ar.message_);
              bidfx_public_api::tools::CountdownLatch::CountDown();
              local_30.ptr_._0_4_ = 0;
              local_38.data_._0_4_ = bidfx_public_api::tools::CountdownLatch::GetCount();
              testing::internal::CmpHelperEQ<int,unsigned_int>
                        ((internal *)&gtest_ar,"0","latch->GetCount()",(int *)&local_30,
                         (uint *)&local_38);
              if (gtest_ar.success_ == false) {
                testing::Message::Message((Message *)&local_30);
                if (gtest_ar.message_.ptr_ ==
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar1 = "";
                }
                else {
                  pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_38,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/countdown_latch_test.cpp"
                           ,0x2c,pcVar1);
                testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_30);
                testing::internal::AssertHelper::~AssertHelper(&local_38);
                testing::internal::
                scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~scoped_ptr(&local_30);
              }
              goto LAB_00198291;
            }
            testing::Message::Message((Message *)&local_30);
            if (gtest_ar.message_.ptr_ ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar1 = "";
            }
            else {
              pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_38,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/countdown_latch_test.cpp"
                       ,0x2a,pcVar1);
            testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_30);
          }
        }
      }
    }
  }
  testing::internal::AssertHelper::~AssertHelper(&local_38);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&local_30);
LAB_00198291:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST(CountdownLatchTest, TestCountdownLatchCounter)
{
    auto latch = new CountdownLatch(5);
    ASSERT_EQ(5, latch->GetCount());
    latch->CountDown();
    ASSERT_EQ(4, latch->GetCount());
    latch->CountDown();
    ASSERT_EQ(3, latch->GetCount());
    latch->CountDown();
    ASSERT_EQ(2, latch->GetCount());
    latch->CountDown();
    ASSERT_EQ(1, latch->GetCount());
    latch->CountDown();
    ASSERT_EQ(0, latch->GetCount());
    latch->CountDown();
    ASSERT_EQ(0, latch->GetCount());
}